

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

SmallVector<diligent_spirv_cross::EntryPoint,_8UL> * __thiscall
diligent_spirv_cross::Compiler::get_entry_points_and_stages
          (SmallVector<diligent_spirv_cross::EntryPoint,_8UL> *__return_storage_ptr__,Compiler *this
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Hash_node_base *p_Var2;
  EntryPoint local_48;
  
  (__return_storage_ptr__->super_VectorView<diligent_spirv_cross::EntryPoint>).ptr =
       (EntryPoint *)0x0;
  (__return_storage_ptr__->super_VectorView<diligent_spirv_cross::EntryPoint>).buffer_size = 0;
  (__return_storage_ptr__->super_VectorView<diligent_spirv_cross::EntryPoint>).ptr =
       (EntryPoint *)&__return_storage_ptr__->stack_storage;
  __return_storage_ptr__->buffer_capacity = 8;
  p_Var2 = (this->ir).entry_points._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    paVar1 = &local_48.name.field_2;
    do {
      local_48.name._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,p_Var2[7]._M_nxt,
                 (long)&(p_Var2[7]._M_nxt)->_M_nxt + (long)&(p_Var2[8]._M_nxt)->_M_nxt);
      local_48.execution_model = *(ExecutionModel *)&p_Var2[0x1f]._M_nxt;
      SmallVector<diligent_spirv_cross::EntryPoint,_8UL>::push_back
                (__return_storage_ptr__,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_48.name._M_dataplus._M_p);
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

SmallVector<EntryPoint> Compiler::get_entry_points_and_stages() const
{
	SmallVector<EntryPoint> entries;
	for (auto &entry : ir.entry_points)
		entries.push_back({ entry.second.orig_name, entry.second.model });
	return entries;
}